

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_general.h
# Opt level: O2

Violation __thiscall
mp::SOS_1or2_Constraint<1>::
ComputeViolationSOS1<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
          (SOS_1or2_Constraint<1> *this,
          VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x)

{
  int iVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  Violation VVar5;
  
  lVar3 = (long)(int)((ulong)((long)(this->v_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                                    .super__Vector_impl_data._M_finish -
                             (long)(this->v_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2);
  iVar2 = 0;
  while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
    bVar4 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::is_nonzero
                      (x,(this->v_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar3]);
    iVar2 = iVar2 + (uint)bVar4;
  }
  iVar1 = 1;
  if (1 < iVar2) {
    iVar1 = iVar2;
  }
  VVar5.viol_ = (double)(iVar1 + -1);
  VVar5.valX_ = 0.0;
  return VVar5;
}

Assistant:

Violation ComputeViolationSOS1(const VarInfo& x) const {
    int nnz=0;
    for (int i=(int)v_.size(); i--; ) {
      if (x.is_nonzero(v_[i]))
        ++nnz;
    }
    return {(double)std::max(0, nnz-1), 0.0};
  }